

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O1

bool __thiscall
cmGetTargetPropertyCommand::InitialPass
          (cmGetTargetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  cmTarget *pcVar9;
  char *__s;
  ostream *poVar10;
  PolicyID id;
  MessageType t;
  string var;
  string prop;
  ostringstream e;
  string local_208;
  string local_1e8;
  char *local_1c8;
  char *local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + pbVar1->_M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  name = pbVar1 + 1;
  local_1c0 = (char *)0x0;
  local_1b8 = '\0';
  local_1c8 = &local_1b8;
  iVar7 = std::__cxx11::string::compare((char *)(pbVar1 + 2));
  pcVar3 = (this->super_cmCommand).Makefile;
  if (iVar7 == 0) {
    bVar6 = cmMakefile::IsAlias(pcVar3,name);
    if (!bVar6) goto LAB_0029d8b5;
    pcVar9 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false);
    bVar6 = pcVar9 != (cmTarget *)0x0;
    if (pcVar9 == (cmTarget *)0x0) goto LAB_0029d899;
    std::__cxx11::string::_M_assign((string *)&local_1c8);
  }
  else {
    pcVar9 = cmMakefile::FindTargetToUse(pcVar3,name,false);
    if (pcVar9 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0045);
      if (PVar8 - NEW < 3) {
        t = FATAL_ERROR;
        bVar4 = true;
        bVar6 = true;
      }
      else {
        bVar4 = false;
        bVar6 = false;
        t = AUTHOR_WARNING;
        if (PVar8 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_208,(cmPolicies *)0x2d,id);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                               local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          bVar6 = false;
          bVar4 = true;
          t = AUTHOR_WARNING;
        }
      }
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"get_target_property() called with non-existent target \"",
                   0x37);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pbVar1[1]._M_dataplus._M_p,
                             pbVar1[1]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".",2);
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar3,t,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar6 = false;
          bVar4 = false;
          goto LAB_0029d895;
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar4 = true;
      bVar6 = false;
    }
    else {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar1[2]._M_string_length == 0) {
        __s = (char *)0x0;
      }
      else {
        __s = cmTarget::GetProperty(pcVar9,pbVar1 + 2,(this->super_cmCommand).Makefile);
      }
      pcVar5 = local_1c0;
      bVar6 = __s != (char *)0x0;
      if (__s == (char *)0x0) {
        bVar4 = true;
      }
      else {
        strlen(__s);
        bVar6 = true;
        std::__cxx11::string::_M_replace((ulong)&local_1c8,0,pcVar5,(ulong)__s);
        bVar4 = true;
      }
    }
LAB_0029d895:
    if (!bVar4) {
      bVar6 = false;
      goto LAB_0029d919;
    }
LAB_0029d899:
    if (!bVar6) {
LAB_0029d8b5:
      pcVar3 = (this->super_cmCommand).Makefile;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1e8._M_dataplus._M_p,
                 local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
      std::__cxx11::string::append(local_1a8);
      cmMakefile::AddDefinition(pcVar3,&local_1e8,(char *)local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      bVar6 = true;
      goto LAB_0029d919;
    }
  }
  bVar6 = true;
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_1e8,local_1c8);
LAB_0029d919:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmGetTargetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string var = args[0];
  const std::string& targetName = args[1];
  std::string prop;
  bool prop_exists = false;

  if(args[2] == "ALIASED_TARGET")
    {
    if(this->Makefile->IsAlias(targetName))
      {
      if(cmTarget* target =
                          this->Makefile->FindTargetToUse(targetName))
        {
        prop = target->GetName();
        prop_exists = true;
        }
      }
    }
  else if(cmTarget* tgt = this->Makefile->FindTargetToUse(targetName))
    {
    cmTarget& target = *tgt;
    const char* prop_cstr = 0;
    if (!args[2].empty())
      {
      prop_cstr = target.GetProperty(args[2], this->Makefile);
      }
    if(prop_cstr)
      {
      prop = prop_cstr;
      prop_exists = true;
      }
    }
  else
    {
    bool issueMessage = false;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0045))
      {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "get_target_property() called with non-existent target \""
        << targetName <<  "\".";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }
  if (prop_exists)
    {
    this->Makefile->AddDefinition(var, prop.c_str());
    return true;
    }
  this->Makefile->AddDefinition(var, (var+"-NOTFOUND").c_str());
  return true;
}